

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

string * __thiscall
t_perl_generator::perl_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this,t_program *p)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ns;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"perl","");
  t_program::get_namespace(&local_70,p,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (local_70._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char *)&local_70,0x3a9598,0);
    if (lVar1 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_98,(ulong)&local_70);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98[0]);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::substr((ulong)local_98,(ulong)&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_98);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        lVar1 = std::__cxx11::string::find((char *)&local_70,0x3a9598,0);
      } while (lVar1 != -1);
    }
    if (local_70._M_string_length != 0) {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)local_98);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98[0]);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string perl_namespace(t_program* p) {
    std::string ns = p->get_namespace("perl");
    std::string result = "";
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        result += ns.substr(0, loc);
        result += "::";
        ns = ns.substr(loc + 1);
      }

      if (ns.size() > 0) {
        result += ns + "::";
      }
    }

    return result;
  }